

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

BasicHandleInfo * __thiscall
helics::HandleManager::getInterfaceHandle
          (HandleManager *this,InterfaceHandle handle,InterfaceType type)

{
  bool bVar1;
  reference pBVar2;
  
  bVar1 = isValidIndex<int,std::deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>>>
                    (handle.hid,&this->handles);
  if (bVar1) {
    pBVar2 = std::
             _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
             ::operator[](&(this->handles).
                           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                           ._M_impl.super__Deque_impl_data._M_start,(long)handle.hid);
    bVar1 = interfaceTypeMatch(pBVar2->handleType,type);
    if (bVar1) {
      return pBVar2;
    }
  }
  return (BasicHandleInfo *)0x0;
}

Assistant:

BasicHandleInfo* HandleManager::getInterfaceHandle(InterfaceHandle handle, InterfaceType type)
{
    auto index = handle.baseValue();
    if (isValidIndex(index, handles)) {
        auto& hand = handles[index];
        if (interfaceTypeMatch(hand.handleType, type)) {
            return &hand;
        }
    }

    return nullptr;
}